

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.h
# Opt level: O3

void __thiscall slang::ast::LookupResult::~LookupResult(LookupResult *this)

{
  pointer p;
  pointer p_00;
  EVP_PKEY_CTX *in_RSI;
  
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&this->diagnostics,in_RSI);
  p = (this->path).super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_;
  if (p != (pointer)(this->path).super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement) {
    operator_delete(p);
  }
  p_00 = (this->selectors).
         super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
         .data_;
  if (p_00 != (pointer)(this->selectors).
                       super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                       .firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

struct SLANG_EXPORT LookupResult {
    /// The symbol that was found by the lookup, or nullptr if no symbol was found.
    /// Note that there can still be errors even if a symbol is found.
    const Symbol* found = nullptr;

    /// If the lookup found a system subroutine, a pointer to it is returned here
    /// and the @a found field will be nullptr.
    const SystemSubroutine* systemSubroutine = nullptr;

    /// If the lookup was via hierarchical path, this indicates the number of
    /// steps upward through the hierarchy we had to take before we started
    /// traversing back down to the found symbol.
    uint32_t upwardCount = 0;

    /// Flags that specify additional information about the result of the lookup.
    bitmask<LookupResultFlags> flags;

    /// A structure that represents a selection of a single member from the resulting
    /// symbol found during a lookup operation.
    struct MemberSelector {
        /// The name of the member to select.
        std::string_view name;

        /// The source location of the dot operator in the name path that
        /// led to selecting this member.
        SourceLocation dotLocation;

        /// The source range of the selection, for reporting diagnostics.
        SourceRange nameRange;
    };

    /// A type that represents a kind of selector for picking a child member
    /// from a found symbol. This can either be a dotted member select or
    /// an indexed element select (from an array).
    using Selector = std::variant<const syntax::ElementSelectSyntax*, MemberSelector>;

    /// A list of selectors that should be applied to the found symbol.
    /// Only applicable if the found symbol is a value symbol.
    SmallVector<Selector, 4> selectors;

    /// If this lookup was via a hierarchical reference, this value contains
    /// information about how the path was resolved.
    SmallVector<HierarchicalReference::Element, 2> path;

    /// Reports a diagnostic that occurred during lookup. The stored diagnostics
    /// are not automatically emitted to the compilation, letting them be suppressed
    /// if desired.
    Diagnostic& addDiag(const Scope& scope, DiagCode code, SourceLocation location);

    /// Reports a diagnostic that occurred during lookup. The stored diagnostics
    /// are not automatically emitted to the compilation, letting them be suppressed
    /// if desired.
    Diagnostic& addDiag(const Scope& scope, DiagCode code, SourceRange sourceRange);

    /// Gets the list of diagnostics that occurred during lookup. The stored diagnostics
    /// are not automatically emitted to the compilation, letting them be suppressed
    /// if desired.
    const Diagnostics& getDiagnostics() const { return diagnostics; }

    /// Returns true if an error occurred during lookup.
    bool hasError() const;

    /// Clears the structure of all results, as if it had been default initialized.
    void clear();

    /// Reports any diagnostics that have occurred during lookup to the given AST
    /// context, which will ensure they are visible to the compilation.
    void reportDiags(const ASTContext& context) const;

    /// Issues a diagnostic if there are selectors in the lookup result.
    void errorIfSelectors(const ASTContext& context) const;

private:
    Diagnostics diagnostics;
}